

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_rawlen(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef TVar2;
  jit_State *in_RDI;
  TRef tr;
  
  uVar1 = *in_RDI->base;
  if ((uVar1 & 0x1f000000) == 0x4000000) {
    (in_RDI->fold).ins.field_0.ot = 0x4313;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)uVar1;
    (in_RDI->fold).ins.field_0.op2 = 0;
    TVar2 = lj_opt_fold(in_RDI);
    *in_RDI->base = TVar2;
  }
  else if ((uVar1 & 0x1f000000) == 0xb000000) {
    TVar2 = lj_ir_call(in_RDI,IRCALL_lj_tab_len,(ulong)uVar1);
    *in_RDI->base = TVar2;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_rawlen(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tref_isstr(tr))
    J->base[0] = emitir(IRTI(IR_FLOAD), tr, IRFL_STR_LEN);
  else if (tref_istab(tr))
    J->base[0] = lj_ir_call(J, IRCALL_lj_tab_len, tr);
  /* else: Interpreter will throw. */
  UNUSED(rd);
}